

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O1

timeval google::protobuf::util::TimeUtil::DurationToTimeval(Duration *value)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  timeval tVar4;
  
  lVar2 = (long)value->nanos_;
  uVar3 = (ulong)(0 < lVar2 % 1000 && lVar2 < -999);
  lVar1 = lVar2 / 1000 + uVar3;
  tVar4.tv_sec = (lVar1 >> 0x3f) + value->seconds_;
  lVar2 = uVar3 + 1000000 + lVar2 / 1000;
  if (-1 < lVar1) {
    lVar2 = lVar1;
  }
  tVar4.tv_usec = lVar2;
  return tVar4;
}

Assistant:

timeval TimeUtil::DurationToTimeval(const Duration& value) {
  timeval result;
  result.tv_sec = value.seconds();
  result.tv_usec = RoundTowardZero(value.nanos(), kNanosPerMicrosecond);
  // timeval.tv_usec's range is [0, 1000000)
  if (result.tv_usec < 0) {
    result.tv_sec -= 1;
    result.tv_usec += kMicrosPerSecond;
  }
  return result;
}